

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O2

void __thiscall
plot::BrailleCanvas::BrailleCanvas(BrailleCanvas *this,Size char_sz,TerminalInfo term)

{
  undefined8 uVar1;
  undefined8 uVar2;
  TerminalInfo TVar3;
  GenericPoint<long> local_38;
  
  TVar3 = term;
  local_38.y = char_sz.y;
  local_38.x = char_sz.x;
  this->lines_ = local_38.y;
  this->cols_ = local_38.x;
  detail::braille::image_t::image_t(&this->blocks_,char_sz);
  (this->stack_).
  super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
  ._M_impl._M_head._M_next = (_Fwd_list_node_base *)0x0;
  (this->available_layers_).
  super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
  ._M_impl._M_head._M_next = (_Fwd_list_node_base *)0x0;
  (this->background_).r = (float)(int)term.background_color._0_8_;
  (this->background_).g = (float)(int)((ulong)term.background_color._0_8_ >> 0x20);
  (this->background_).b = (float)(int)term.background_color._8_8_;
  (this->background_).a = (float)(int)((ulong)term.background_color._8_8_ >> 0x20);
  uVar1 = term._16_8_;
  uVar2 = term.background_color._4_8_;
  (this->term_).mode = term.mode;
  (this->term_).foreground_color.r = term.foreground_color.r;
  (this->term_).foreground_color.g = term.foreground_color.g;
  (this->term_).foreground_color.b = term.foreground_color.b;
  *(undefined8 *)&(this->term_).foreground_color.a = uVar1;
  (this->term_).background_color.g = (float)(int)uVar2;
  (this->term_).background_color.b = (float)(int)((ulong)uVar2 >> 0x20);
  *(long *)&(this->term_).background_color.a = TVar3._32_8_;
  std::forward_list<plot::detail::braille::image_t,std::allocator<plot::detail::braille::image_t>>::
  emplace_front<plot::GenericPoint<long>&>
            ((forward_list<plot::detail::braille::image_t,std::allocator<plot::detail::braille::image_t>>
              *)&this->available_layers_,&local_38);
  return;
}

Assistant:

BrailleCanvas(Size char_sz, TerminalInfo term = TerminalInfo())
        : lines_(char_sz.y), cols_(char_sz.x), blocks_(char_sz),
          background_(term.background_color), term_(term)
    {
        available_layers_.emplace_front(char_sz);
    }